

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendsig.c
# Opt level: O0

void duh_sigrenderer_set_sigparam(DUH_SIGRENDERER *sigrenderer,uchar id,int32 value)

{
  undefined4 in_EDX;
  undefined1 in_SIL;
  long *in_RDI;
  DUH_SIGRENDERER_SET_SIGPARAM proc;
  
  if ((in_RDI != (long *)0x0) && (*(code **)(*in_RDI + 0x18) != (code *)0x0)) {
    (**(code **)(*in_RDI + 0x18))(in_RDI[1],in_SIL,in_EDX,in_SIL);
  }
  return;
}

Assistant:

void DUMBEXPORT duh_sigrenderer_set_sigparam(
	DUH_SIGRENDERER *sigrenderer,
	unsigned char id, int32 value
)
{
	DUH_SIGRENDERER_SET_SIGPARAM proc;

	if (!sigrenderer) return;

	proc = sigrenderer->desc->sigrenderer_set_sigparam;
	if (proc)
		(*proc)(sigrenderer->sigrenderer, id, value);
	else
		TRACE("Parameter #%d = %d for signal %c%c%c%c, which does not take parameters.\n",
			(int)id,
			value,
			(int)(sigrenderer->desc->type >> 24),
			(int)(sigrenderer->desc->type >> 16),
			(int)(sigrenderer->desc->type >> 8),
			(int)(sigrenderer->desc->type));
}